

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O1

void __thiscall
MeshLib::StringTokenizer::StringTokenizer(StringTokenizer *this,char *buffer,char *seperator)

{
  size_t sVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  
  (this->m_tokens).m_head = (ListNode<char> *)0x0;
  (this->m_tokens).m_size = 0;
  sVar1 = strlen(buffer);
  uVar3 = (uint)sVar1;
  if (uVar3 != 0) {
    if (0 < (int)uVar3) {
      uVar4 = (ulong)(uVar3 & 0x7fffffff);
      pcVar5 = buffer + 1;
      do {
        pcVar2 = strchr(seperator,(int)pcVar5[-1]);
        if (pcVar2 != (char *)0x0) {
          pcVar5[-1] = '\0';
          List<char>::Append(&this->m_tokens,buffer);
          buffer = pcVar5;
        }
        pcVar5 = pcVar5 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    List<char>::Append(&this->m_tokens,buffer);
  }
  return;
}

Assistant:

StringTokenizer::StringTokenizer( char * buffer, const char * seperator )
{

	char * pStr = NULL;

	int str_len = (int)strlen( buffer    );

	if( str_len == 0 ) return;

	pStr = buffer;

	for( int i = 0; i < str_len; i ++ )
	{
		char c = buffer[i];

		if( strchr( seperator, c ) )
		{
			buffer[i] = 0;
			m_tokens.Append( pStr );
			pStr = buffer+i+1;
		}
	
	}

	m_tokens.Append( pStr );
}